

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolutiondepthwise_batchnorm(NetOptimize *this)

{
  float fVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  reference ppLVar4;
  reference pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float *pfVar9;
  reference pvVar10;
  Mat *pMVar11;
  reference pvVar12;
  int iVar13;
  long in_RDI;
  double dVar14;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_2;
  float *bias;
  float *weight;
  int weight_per_outch;
  float sqrt_var;
  int i_1;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  float eps;
  int channels;
  BatchNorm *batchnorm;
  ConvolutionDepthWise *convolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  Allocator *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  float in_stack_fffffffffffffe58;
  value_type in_stack_fffffffffffffe5c;
  Mat *in_stack_fffffffffffffe60;
  float *in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  int local_10c;
  int local_fc;
  int local_90;
  vector<float,_std::allocator<float>_> local_88 [2];
  vector<float,_std::allocator<float>_> local_58;
  float local_40;
  int local_3c;
  value_type local_38;
  value_type local_30;
  size_type local_28;
  value_type local_1c;
  size_type local_18;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (local_10 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            (char *)in_stack_fffffffffffffe48);
    if (!bVar2) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->tops,0);
      local_1c = *pvVar5;
      local_28 = local_18;
      do {
        do {
          do {
            local_28 = local_28 + 1;
            if (local_10 <= local_28) goto LAB_001535aa;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_28);
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                                    ,(char *)in_stack_fffffffffffffe48);
          } while (bVar2);
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar4)->bottoms);
        } while (sVar6 != 1);
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->bottoms,0);
      } while (*pvVar5 != local_1c);
LAB_001535aa:
      if (local_28 != local_10) {
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        local_30 = *ppLVar4;
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        __stream = _stderr;
        local_38 = *ppLVar4;
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_convolutiondepthwise_batchnorm %s %s\n",uVar7,uVar8);
        local_3c = *(int *)&local_38[1]._vptr_Layer;
        local_40 = *(float *)((long)&local_38[1]._vptr_Layer + 4);
        std::allocator<float>::allocator((allocator<float> *)0x1536bc);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (size_type)in_stack_fffffffffffffe68,(allocator_type *)in_stack_fffffffffffffe60)
        ;
        std::allocator<float>::~allocator((allocator<float> *)0x1536e8);
        std::allocator<float>::allocator((allocator<float> *)0x153707);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (size_type)in_stack_fffffffffffffe68,(allocator_type *)in_stack_fffffffffffffe60)
        ;
        std::allocator<float>::~allocator((allocator<float> *)0x15372d);
        for (local_90 = 0; local_90 < local_3c; local_90 = local_90 + 1) {
          pfVar9 = ncnn::Mat::operator[]
                             ((Mat *)&local_38[1].tops.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)local_90);
          dVar14 = std::sqrt((double)(ulong)(uint)(*pfVar9 + local_40));
          pfVar9 = ncnn::Mat::operator[]((Mat *)&local_38[2].support_tensor_storage,(long)local_90);
          in_stack_fffffffffffffe74 = *pfVar9;
          pfVar9 = ncnn::Mat::operator[]((Mat *)&local_38[1].one_blob_only,(long)local_90);
          fVar1 = *pfVar9;
          pfVar9 = ncnn::Mat::operator[]((Mat *)&local_38[1].name,(long)local_90);
          in_stack_fffffffffffffe74 =
               in_stack_fffffffffffffe74 - (fVar1 * *pfVar9) / SUB84(dVar14,0);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](&local_58,(long)local_90)
          ;
          *pvVar10 = in_stack_fffffffffffffe74;
          pfVar9 = ncnn::Mat::operator[]((Mat *)&local_38[1].one_blob_only,(long)local_90);
          in_stack_fffffffffffffe70 = *pfVar9 / SUB84(dVar14,0);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](local_88,(long)local_90);
          *pvVar10 = in_stack_fffffffffffffe70;
        }
        if (*(int *)&local_30[1].type == 0) {
          *(undefined4 *)&local_30[1].type = 1;
          ncnn::Mat::Mat(in_stack_fffffffffffffe60,(int)in_stack_fffffffffffffe5c,
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
          ncnn::Mat::operator=
                    ((Mat *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (Mat *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          ncnn::Mat::~Mat((Mat *)0x1539bd);
          ncnn::Mat::fill(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        }
        iVar3 = *(int *)&local_30[1].type.field_0x4 / local_3c;
        pfVar9 = ncnn::Mat::operator_cast_to_float_
                           ((Mat *)&local_30[1].tops.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        in_stack_fffffffffffffe68 = pfVar9;
        pMVar11 = (Mat *)ncnn::Mat::operator_cast_to_float_
                                   ((Mat *)&local_30[2].support_tensor_storage);
        in_stack_fffffffffffffe60 = pMVar11;
        for (local_fc = 0; local_fc < local_3c; local_fc = local_fc + 1) {
          iVar13 = iVar3 * local_fc;
          for (local_10c = 0; local_10c < iVar3; local_10c = local_10c + 1) {
            pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                (local_88,(long)local_fc);
            pfVar9[(long)iVar13 + (long)local_10c] =
                 *pvVar10 * pfVar9[(long)iVar13 + (long)local_10c];
          }
          in_stack_fffffffffffffe58 = *(float *)((long)&pMVar11->data + (long)local_fc * 4);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](local_88,(long)local_fc);
          in_stack_fffffffffffffe5c = *pvVar10;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](&local_58,(long)local_fc)
          ;
          *(float *)((long)&pMVar11->data + (long)local_fc * 4) =
               in_stack_fffffffffffffe58 * in_stack_fffffffffffffe5c + *pvVar10;
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe60);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_38->tops,0);
        iVar3 = *pvVar5;
        in_stack_fffffffffffffe50 = iVar3;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30->tops,0);
        *pvVar5 = in_stack_fffffffffffffe50;
        in_stack_fffffffffffffe54 = (int)local_18;
        pvVar12 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar3);
        pvVar12->producer = in_stack_fffffffffffffe54;
        std::__cxx11::string::operator=((string *)&local_38->type,"ncnnfused");
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BatchNorm to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_batchnorm %s %s\n", convolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (convolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                convolutiondepthwise->bias_term = 1;
                convolutiondepthwise->bias_data = ncnn::Mat(channels);
                convolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = convolutiondepthwise->weight_data_size / channels;

            float* weight = convolutiondepthwise->weight_data;
            float* bias = convolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}